

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O1

int __thiscall
de::BlockBuffer<unsigned_char>::readFromCurrentBlock
          (BlockBuffer<unsigned_char> *this,int numElements,uchar *elements,bool blocking)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  deBool dVar4;
  undefined8 *puVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (this->m_readPos == 0) {
    if (blocking) {
      deSemaphore_decrement(this->m_fill);
    }
    else {
      dVar4 = deSemaphore_tryDecrement(this->m_fill);
      if (dVar4 == 0) {
        return 0;
      }
    }
    if (this->m_canceled != 0) {
      deSemaphore_increment(this->m_fill);
      Mutex::unlock(&this->m_readLock);
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = &PTR__exception_0012b760;
      __cxa_throw(puVar5,&BufferCanceledException::typeinfo,std::exception::~exception);
    }
  }
  iVar6 = this->m_readBlock;
  iVar1 = this->m_numUsedInBlock[iVar6];
  uVar7 = iVar1 - this->m_readPos;
  uVar9 = (ulong)uVar7;
  if (numElements < (int)uVar7) {
    uVar9 = (ulong)(uint)numElements;
  }
  iVar8 = (int)uVar9;
  if (0 < iVar8) {
    iVar2 = this->m_blockSize;
    puVar3 = this->m_elements;
    uVar10 = 0;
    do {
      elements[uVar10] = puVar3[(long)(this->m_readPos + (int)uVar10) + (long)(iVar6 * iVar2)];
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  iVar6 = this->m_readPos + iVar8;
  this->m_readPos = iVar6;
  if (iVar6 == iVar1) {
    this->m_readBlock = (this->m_readBlock + 1) % this->m_numBlocks;
    this->m_readPos = 0;
    deSemaphore_increment(this->m_empty);
  }
  return iVar8;
}

Assistant:

int BlockBuffer<T>::readFromCurrentBlock (int numElements, T* elements, bool blocking)
{
	DE_ASSERT(numElements > 0 && elements != DE_NULL);

	if (m_readPos == 0)
	{
		/* Read thread doesn't own current block - need to acquire. */
		if (blocking)
			deSemaphore_decrement(m_fill);
		else
		{
			if (!deSemaphore_tryDecrement(m_fill))
				return 0;
		}

		/* Check for canceled bit. */
		if (m_canceled)
		{
			// \todo [2012-07-06 pyry] A bit hackish to assume that read lock is not freed if exception is thrown out here.
			deSemaphore_increment(m_fill);
			m_readLock.unlock();
			throw CanceledException();
		}
	}

	/* Read thread now owns current block. */
	const T*	block			= m_elements + m_readBlock*m_blockSize;
	int			numUsedInBlock	= m_numUsedInBlock[m_readBlock];
	int			numToRead		= de::min(numElements, numUsedInBlock-m_readPos);

	DE_ASSERT(numToRead > 0);

	for (int ndx = 0; ndx < numToRead; ndx++)
		elements[ndx] = block[m_readPos+ndx];

	m_readPos += numToRead;

	if (m_readPos == numUsedInBlock)
	{
		/* Free current read block and advance. */
		m_readBlock		= (m_readBlock+1) % m_numBlocks;
		m_readPos		= 0;
		deSemaphore_increment(m_empty);
	}

	return numToRead;
}